

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

Matrix<float> __thiscall Matrix<float>::operator+(Matrix<float> *this,Matrix<float> *M1)

{
  uint b;
  float **ppfVar1;
  float *pfVar2;
  float **ppfVar3;
  float **ppfVar4;
  float **ppfVar5;
  float **in_RDX;
  float **ppfVar6;
  int j;
  float **ppfVar7;
  Matrix<float> MVar8;
  
  ppfVar6 = in_RDX;
  if (M1->n == *(int *)in_RDX) {
    b = M1->m;
    ppfVar6 = (float **)(ulong)b;
    if (b == *(uint *)((long)in_RDX + 4)) {
      Matrix(this,M1->n,b);
      ppfVar5 = (float **)0x0;
      ppfVar4 = (float **)(ulong)(uint)M1->m;
      if (M1->m < 1) {
        ppfVar4 = ppfVar5;
      }
      ppfVar6 = (float **)(ulong)(uint)M1->n;
      if (M1->n < 1) {
        ppfVar6 = ppfVar5;
      }
      for (; ppfVar5 != ppfVar6; ppfVar5 = (float **)((long)ppfVar5 + 1)) {
        ppfVar1 = M1->M;
        pfVar2 = in_RDX[1];
        ppfVar3 = this->M;
        for (ppfVar7 = (float **)0x0; ppfVar4 != ppfVar7; ppfVar7 = (float **)((long)ppfVar7 + 1)) {
          ppfVar3[(long)ppfVar5][(long)ppfVar7] =
               ppfVar1[(long)ppfVar5][(long)ppfVar7] +
               *(float *)(*(long *)(pfVar2 + (long)ppfVar5 * 2) + (long)ppfVar7 * 4);
        }
      }
      goto LAB_0010a6b2;
    }
  }
  this->n = 0;
  this->m = 0;
  this->M = (float **)0x0;
LAB_0010a6b2:
  MVar8.M = ppfVar6;
  MVar8._0_8_ = this;
  return MVar8;
}

Assistant:

Matrix operator+(const Matrix& M1) const {
    if (n != M1.n || m != M1.m) {
      Matrix<T> Zero;
      return Zero;
    }
    Matrix<T> add(n, m);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        add.M[i][j] = M[i][j] + M1.M[i][j];
      }
    }
    return add;
  }